

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::CosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::CosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::CosOp>_>
::UnaryBuiltinVecFunc
          (UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::CosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::CosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::CosOp>_>
           *this,GeneratorState *state,char *function,ConstValueRangeAccess valueRange)

{
  pointer pSVar1;
  pointer pSVar2;
  VariableType *type;
  long lVar3;
  long lVar4;
  pointer pSVar5;
  pointer pSVar6;
  ConstValueRangeAccess outRange;
  ConstValueRangeAccess local_48;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__UnaryBuiltinVecFunc_00c46020;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_function,function,(allocator<char> *)&local_48);
  type = valueRange.m_type;
  ValueRange::ValueRange(&this->m_inValueRange,valueRange.m_type);
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_child = (Expression *)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ValueStorage<64>::setStorage(&this->m_value,type);
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < (this->m_inValueRange).m_type.m_numElements; lVar3 = lVar3 + 1) {
    ConstValueRangeAccess::component(&local_48,&valueRange,(int)lVar3);
    pSVar6 = (this->m_inValueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->m_inValueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar5 = (this->m_inValueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar2 = (this->m_inValueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    VariableType::getElementType(&(this->m_inValueRange).m_type);
    if (pSVar5 == pSVar2) {
      pSVar5 = (pointer)0x0;
    }
    if (pSVar6 == pSVar1) {
      pSVar6 = (pointer)0x0;
    }
    UnaryTrigonometricFunc<rsg::CosOp>::computeValueRange
              ((local_48.m_min)->floatVal,(local_48.m_max)->floatVal,(float *)((long)pSVar6 + lVar4)
               ,(float *)((long)pSVar5 + lVar4));
    lVar4 = lVar4 + 4;
  }
  return;
}

Assistant:

UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::UnaryBuiltinVecFunc (GeneratorState& state, const char* function, ConstValueRangeAccess valueRange)
	: m_function		(function)
	, m_inValueRange	(valueRange.getType())
	, m_child			(DE_NULL)
{
	DE_UNREF(state);
	DE_ASSERT(valueRange.getType().isFloatOrVec());

	m_value.setStorage(valueRange.getType());

	// Compute input value range
	for (int ndx = 0; ndx < m_inValueRange.getType().getNumElements(); ndx++)
	{
		ConstValueRangeAccess	outRange	= valueRange.component(ndx);
		ValueRangeAccess		inRange		= m_inValueRange.asAccess().component(ndx);

		ComputeValueRange()(outRange.getMin().asFloat(), outRange.getMax().asFloat(), inRange.getMin().asFloat(), inRange.getMax().asFloat());
	}
}